

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O3

string * __thiscall
cmRulePlaceholderExpander::ExpandRuleVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,
          cmOutputConverter *outputConverter,string *variable,RuleVariables *replaceValues)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  iterator iVar3;
  long *plVar4;
  size_t sVar5;
  string *in_relative;
  long lVar6;
  mapped_type *pmVar7;
  size_type *psVar8;
  ulong *puVar9;
  char *pcVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  pointer pcVar13;
  _Base_ptr __rhs;
  string sysroot;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  mapped_type *local_58;
  mapped_type *local_50;
  mapped_type *local_48;
  mapped_type *local_40;
  mapped_type *local_38;
  
  if ((replaceValues->LinkFlags != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->LinkFlags;
    goto LAB_002d9109;
  }
  if ((replaceValues->Manifests != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Manifests;
    goto LAB_002d9109;
  }
  if ((replaceValues->Flags != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Flags;
    goto LAB_002d9109;
  }
  if ((replaceValues->Source != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Source;
    goto LAB_002d9109;
  }
  if ((replaceValues->PreprocessedSource != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->PreprocessedSource;
    goto LAB_002d9109;
  }
  if ((replaceValues->AssemblySource != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->AssemblySource;
    goto LAB_002d9109;
  }
  if ((replaceValues->Object != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Object;
    goto LAB_002d9109;
  }
  if ((replaceValues->ObjectDir != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->ObjectDir;
    goto LAB_002d9109;
  }
  if ((replaceValues->ObjectFileDir != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->ObjectFileDir;
    goto LAB_002d9109;
  }
  if ((replaceValues->Objects != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Objects;
    goto LAB_002d9109;
  }
  if ((replaceValues->ObjectsQuoted != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->ObjectsQuoted;
    goto LAB_002d9109;
  }
  if ((replaceValues->Defines != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Defines;
    goto LAB_002d9109;
  }
  if ((replaceValues->Includes != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->Includes;
    goto LAB_002d9109;
  }
  if ((replaceValues->TargetPDB != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->TargetPDB;
    goto LAB_002d9109;
  }
  if ((replaceValues->TargetCompilePDB != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->TargetCompilePDB;
    goto LAB_002d9109;
  }
  if ((replaceValues->DependencyFile != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar12 = replaceValues->DependencyFile;
    goto LAB_002d9109;
  }
  if (replaceValues->Target == (char *)0x0) {
LAB_002d8f22:
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if ((iVar2 == 0) ||
       ((iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0 ||
        (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)))) {
      if (replaceValues->TargetSOName != (char *)0x0) {
        iVar2 = std::__cxx11::string::compare((char *)variable);
        if (iVar2 == 0) {
          pcVar12 = replaceValues->TargetSOName;
          goto LAB_002d9109;
        }
        iVar2 = std::__cxx11::string::compare((char *)variable);
        if ((iVar2 == 0) && (pcVar12 = replaceValues->SONameFlag, pcVar12 != (char *)0x0)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar5 = strlen(pcVar12);
          pcVar10 = pcVar12 + sVar5;
          goto LAB_002d9195;
        }
        if ((replaceValues->TargetInstallNameDir != (char *)0x0) &&
           (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
          pcVar12 = replaceValues->TargetInstallNameDir;
          goto LAB_002d9109;
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "";
      pcVar12 = "";
      goto LAB_002d9195;
    }
    if ((replaceValues->LinkLibraries != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar12 = replaceValues->LinkLibraries;
LAB_002d9109:
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar12,(allocator *)&local_a0);
      return __return_storage_ptr__;
    }
    if ((replaceValues->Language != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar12 = replaceValues->Language;
      goto LAB_002d9109;
    }
    if ((replaceValues->CMTargetName != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar12 = replaceValues->CMTargetName;
      goto LAB_002d9109;
    }
    if ((replaceValues->CMTargetType != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar12 = replaceValues->CMTargetType;
      goto LAB_002d9109;
    }
    if ((replaceValues->Output != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar12 = replaceValues->Output;
      goto LAB_002d9109;
    }
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 != 0) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->Compilers)._M_t,variable);
      local_60 = &this->VariableMappings;
      if ((_Rb_tree_header *)iVar3._M_node == &(this->Compilers)._M_t._M_impl.super__Rb_tree_header)
      {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_60->_M_t,variable);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar13 = (variable->_M_dataplus)._M_p;
          p_Var11 = (_Base_ptr)variable->_M_string_length;
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)variable,0x5d4f26,0);
          if (lVar6 == -1) {
            cmOutputConverter::ConvertToOutputForExisting
                      (__return_storage_ptr__,outputConverter,(string *)(iVar3._M_node + 2),SHELL);
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar13 = *(pointer *)(iVar3._M_node + 2);
          p_Var11 = iVar3._M_node[2]._M_parent;
        }
LAB_002d928d:
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar13,
                   (pointer)((long)&p_Var11->_M_color + (long)pcVar13));
        return __return_storage_ptr__;
      }
      __rhs = iVar3._M_node + 2;
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      paVar1 = &local_a0.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_60,&local_a0);
      cmOutputConverter::ConvertToOutputForExisting
                (__return_storage_ptr__,outputConverter,pmVar7,SHELL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_38 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_40 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_50 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_48 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar8;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_58 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_80,"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_a0.field_2._M_allocated_capacity = *puVar9;
        local_a0.field_2._8_8_ = plVar4[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *puVar9;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_38->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_38->_M_dataplus)._M_p);
      }
      if ((local_40->_M_string_length != 0) && (local_50->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_50->_M_dataplus)._M_p);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_40->_M_dataplus)._M_p);
      }
      if ((local_48->_M_string_length != 0) && (local_58->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(local_58->_M_dataplus)._M_p);
        cmOutputConverter::EscapeForShell(&local_a0,outputConverter,local_48,true,false,false);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity =
           local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_assign((string *)&local_a0);
      if ((local_a0._M_string_length != 0) && (pmVar7->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(pmVar7->_M_dataplus)._M_p);
        cmOutputConverter::EscapeForShell(&local_80,outputConverter,&local_a0,true,false,false);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == paVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_002d9a58;
    }
    in_relative = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmsys::SystemTools::CollapseFullPath(&local_a0,in_relative);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,outputConverter,&local_a0,SHELL)
    ;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&local_a0);
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 != 0) {
      if ((replaceValues->LanguageCompileFlags != (char *)0x0) &&
         (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
        pcVar12 = replaceValues->LanguageCompileFlags;
        goto LAB_002d9109;
      }
      if ((replaceValues->Target != (char *)0x0) &&
         (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
        pcVar12 = replaceValues->Target;
        goto LAB_002d9109;
      }
      iVar2 = std::__cxx11::string::compare((char *)variable);
      if (iVar2 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar13 = (this->TargetImpLib)._M_dataplus._M_p;
        p_Var11 = (_Base_ptr)(this->TargetImpLib)._M_string_length;
        goto LAB_002d928d;
      }
      iVar2 = std::__cxx11::string::compare((char *)variable);
      if (iVar2 == 0) {
        pcVar12 = replaceValues->TargetVersionMajor;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)variable);
        if (iVar2 != 0) {
          if ((replaceValues->Target == (char *)0x0) ||
             (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 != 0))
          goto LAB_002d8f22;
          std::__cxx11::string::string
                    ((string *)&local_a0,replaceValues->Target,(allocator *)&local_80);
          lVar6 = std::__cxx11::string::rfind((char)&local_a0,0x2e);
          if (lVar6 == -1) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_a0.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a0.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_a0._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_a0.field_2._M_allocated_capacity;
            }
            __return_storage_ptr__->_M_string_length = local_a0._M_string_length;
            return __return_storage_ptr__;
          }
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_a0);
          goto LAB_002d93bb;
        }
        pcVar12 = replaceValues->TargetVersionMinor;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "0";
        pcVar10 = "";
      }
      else {
        sVar5 = strlen(pcVar12);
        pcVar10 = pcVar12 + sVar5;
      }
LAB_002d9195:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar12,pcVar10);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&local_a0);
    if (__return_storage_ptr__->_M_string_length < 3) {
      return __return_storage_ptr__;
    }
    pcVar12 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (*pcVar12 != '\"') {
      return __return_storage_ptr__;
    }
    if (pcVar12[__return_storage_ptr__->_M_string_length - 1] != '\"') {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
  }
LAB_002d93bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    return __return_storage_ptr__;
  }
LAB_002d9a58:
  operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandRuleVariable(
  cmOutputConverter* outputConverter, std::string const& variable,
  const RuleVariables& replaceValues)
{
  if (replaceValues.LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return replaceValues.LinkFlags;
    }
  }
  if (replaceValues.Manifests) {
    if (variable == "MANIFESTS") {
      return replaceValues.Manifests;
    }
  }
  if (replaceValues.Flags) {
    if (variable == "FLAGS") {
      return replaceValues.Flags;
    }
  }

  if (replaceValues.Source) {
    if (variable == "SOURCE") {
      return replaceValues.Source;
    }
  }
  if (replaceValues.PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return replaceValues.PreprocessedSource;
    }
  }
  if (replaceValues.AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return replaceValues.AssemblySource;
    }
  }
  if (replaceValues.Object) {
    if (variable == "OBJECT") {
      return replaceValues.Object;
    }
  }
  if (replaceValues.ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return replaceValues.ObjectDir;
    }
  }
  if (replaceValues.ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return replaceValues.ObjectFileDir;
    }
  }
  if (replaceValues.Objects) {
    if (variable == "OBJECTS") {
      return replaceValues.Objects;
    }
  }
  if (replaceValues.ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return replaceValues.ObjectsQuoted;
    }
  }
  if (replaceValues.Defines && variable == "DEFINES") {
    return replaceValues.Defines;
  }
  if (replaceValues.Includes && variable == "INCLUDES") {
    return replaceValues.Includes;
  }
  if (replaceValues.TargetPDB) {
    if (variable == "TARGET_PDB") {
      return replaceValues.TargetPDB;
    }
  }
  if (replaceValues.TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return replaceValues.TargetCompilePDB;
    }
  }
  if (replaceValues.DependencyFile) {
    if (variable == "DEP_FILE") {
      return replaceValues.DependencyFile;
    }
  }

  if (replaceValues.Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = replaceValues.Target;
      if (!targetQuoted.empty() && targetQuoted[0] != '\"') {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted[0] == '\"' && unquoted[sz - 1] == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (replaceValues.LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return replaceValues.LanguageCompileFlags;
      }
    }
    if (replaceValues.Target) {
      if (variable == "TARGET") {
        return replaceValues.Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (replaceValues.TargetVersionMajor) {
        return replaceValues.TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (replaceValues.TargetVersionMinor) {
        return replaceValues.TargetVersionMinor;
      }
      return "0";
    }
    if (replaceValues.Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (replaceValues.TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return replaceValues.TargetSOName;
      }
      if (variable == "SONAME_FLAG" && replaceValues.SONameFlag) {
        return replaceValues.SONameFlag;
      }
      if (replaceValues.TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return replaceValues.TargetInstallNameDir;
      }
    }
    return "";
  }
  if (replaceValues.LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return replaceValues.LinkLibraries;
    }
  }
  if (replaceValues.Language) {
    if (variable == "LANGUAGE") {
      return replaceValues.Language;
    }
  }
  if (replaceValues.CMTargetName) {
    if (variable == "TARGET_NAME") {
      return replaceValues.CMTargetName;
    }
  }
  if (replaceValues.CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return replaceValues.CMTargetType;
    }
  }
  if (replaceValues.Output) {
    if (variable == "OUTPUT") {
      return replaceValues.Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return outputConverter->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(cmSystemTools::GetCMakeCommand()),
      cmOutputConverter::SHELL);
  }

  std::map<std::string, std::string>::iterator compIt =
    this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = outputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    // if there is a required first argument to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret += outputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (replaceValues.LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += outputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  std::map<std::string, std::string>::iterator mapIt =
    this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      return outputConverter->ConvertToOutputForExisting(mapIt->second);
    }
    return mapIt->second;
  }
  return variable;
}